

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  undefined1 auVar1 [12];
  ImU32 IVar2;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  void *pvVar4;
  bool bVar5;
  ImU32 IVar6;
  int iVar7;
  ImU32 IVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint in_XMM0_Db;
  ImVec2 IVar15;
  ImVec2 pos;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined4 in_XMM1_Db;
  float fVar16;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar17;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar18;
  undefined8 uVar20;
  undefined1 auVar19 [16];
  float fVar21;
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  ImVec2 local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  void *local_c0;
  ImGuiWindow *local_b8;
  ImVec2 local_b0;
  float local_a4;
  ImRect local_a0;
  ImGuiContext *local_90;
  ulong local_88;
  ImRect local_80;
  char *local_70;
  undefined1 local_68 [16];
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  ImRect local_40;
  
  pIVar3 = GImGui;
  local_b8 = GImGui->CurrentWindow;
  local_b8->WriteAccessed = true;
  if (local_b8->SkipItems == false) {
    local_e8._4_4_ = in_XMM1_Db;
    local_e8._0_4_ = scale_max;
    local_e8._8_4_ = in_XMM1_Dc;
    local_e8._12_4_ = in_XMM1_Dd;
    local_f8._8_4_ = in_XMM2_Dc;
    local_f8._0_8_ = graph_size;
    local_f8._12_4_ = in_XMM2_Dd;
    local_d8 = scale_min;
    uStack_d4 = in_XMM0_Db;
    uStack_d0 = in_XMM0_Dc;
    uStack_cc = in_XMM0_Dd;
    IVar15 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar20 = local_f8._8_8_;
    local_68._8_4_ = (int)extraout_XMM0_Qb;
    local_68._0_4_ = IVar15.x;
    local_68._4_4_ = IVar15.y;
    local_68._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    fVar12 = IVar15.x;
    fVar14 = IVar15.y;
    if ((local_f8._0_4_ == 0.0) && (!NAN(local_f8._0_4_))) {
      fVar12 = CalcItemWidth();
      auVar1._4_8_ = uVar20;
      auVar1._0_4_ = local_f8._4_4_;
      auVar19._0_8_ = auVar1._0_8_ << 0x20;
      auVar19._8_4_ = local_f8._8_4_;
      auVar19._12_4_ = local_f8._12_4_;
      local_f8._4_12_ = auVar19._4_12_;
      local_f8._0_4_ = fVar12;
      fVar12 = (float)local_68._0_4_;
      fVar14 = (float)local_68._4_4_;
    }
    local_80.Max.y = local_f8._4_4_;
    if ((local_80.Max.y != 0.0) || (NAN(local_80.Max.y))) {
      fVar13 = (pIVar3->Style).FramePadding.y;
    }
    else {
      fVar13 = (pIVar3->Style).FramePadding.y;
      local_80.Max.y = fVar13 + fVar13 + fVar14;
      local_f8._4_4_ = local_80.Max.y;
    }
    local_80.Min.x = (local_b8->DC).CursorPos.x;
    local_80.Min.y = (local_b8->DC).CursorPos.y;
    local_80.Max.x = local_f8._0_4_ + local_80.Min.x;
    local_80.Max.y = local_80.Max.y + local_80.Min.y;
    fVar14 = (pIVar3->Style).FramePadding.x;
    local_a0.Min.x = fVar14 + local_80.Min.x;
    local_a0.Min.y = local_80.Min.y + fVar13;
    local_a0.Max.x = local_80.Max.x - fVar14;
    local_a0.Max.y = local_80.Max.y - fVar13;
    local_40.Max.x = 0.0;
    if (0.0 < fVar12) {
      local_40.Max.x = (pIVar3->Style).ItemInnerSpacing.x + fVar12;
    }
    local_40.Max.x = local_80.Max.x + local_40.Max.x;
    local_40.Max.y = local_80.Max.y + 0.0;
    local_40.Min.x = local_80.Min.x;
    local_40.Min.y = local_80.Min.y;
    ItemSize(&local_40,fVar13);
    bVar5 = ItemAdd(&local_40,0,&local_80);
    if (bVar5) {
      bVar5 = ItemHoverable(&local_a0,0);
      local_c0 = data;
      local_70 = label;
      if (((local_d8 == 3.4028235e+38) && (!NAN(local_d8))) ||
         (((float)local_e8._0_4_ == 3.4028235e+38 && (!NAN((float)local_e8._0_4_))))) {
        if (values_count < 1) {
          fVar14 = -3.4028235e+38;
          fVar12 = 3.4028235e+38;
        }
        else {
          iVar10 = 0;
          fVar14 = -3.4028235e+38;
          fVar12 = 3.4028235e+38;
          do {
            fVar13 = (*values_getter)(data,iVar10);
            if (fVar13 <= fVar12) {
              fVar12 = fVar13;
            }
            fVar14 = (float)(-(uint)(fVar13 <= fVar14) & (uint)fVar14 |
                            ~-(uint)(fVar13 <= fVar14) & (uint)fVar13);
            iVar10 = iVar10 + 1;
          } while (values_count != iVar10);
        }
        uStack_d4 = 0;
        uStack_d0 = 0;
        uStack_cc = 0;
        local_d8 = (float)(~-(uint)(local_d8 == 3.4028235e+38) & (uint)local_d8 |
                          (uint)fVar12 & -(uint)(local_d8 == 3.4028235e+38));
        local_e8._0_4_ =
             ~-(uint)((float)local_e8._0_4_ == 3.4028235e+38) & local_e8._0_4_ |
             (uint)fVar14 & -(uint)((float)local_e8._0_4_ == 3.4028235e+38);
      }
      IVar15.y = local_80.Min.y;
      IVar15.x = local_80.Min.x;
      p_max.y = local_80.Max.y;
      p_max.x = local_80.Max.x;
      IVar6 = GetColorU32(7,1.0);
      local_90 = pIVar3;
      RenderFrame(IVar15,p_max,IVar6,true,(pIVar3->Style).FrameRounding);
      pvVar4 = local_c0;
      if (0 < values_count) {
        iVar10 = (int)(float)local_f8._0_4_;
        if (values_count <= (int)(float)local_f8._0_4_) {
          iVar10 = values_count;
        }
        iVar7 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
        uVar11 = 0xffffffff;
        if (bVar5) {
          fVar14 = ((local_90->IO).MousePos.x - local_a0.Min.x) / (local_a0.Max.x - local_a0.Min.x);
          fVar12 = 0.9999;
          if (fVar14 <= 0.9999) {
            fVar12 = fVar14;
          }
          uVar9 = (uint)((float)iVar7 * (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar12));
          uVar11 = (ulong)uVar9;
          fVar12 = (*values_getter)(local_c0,(int)(values_offset + uVar9) % values_count);
          (*values_getter)(pvVar4,(int)(values_offset + uVar9 + 1) % values_count);
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar9,(ulong)(uVar9 + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)fVar12,uVar11);
          }
        }
        iVar10 = iVar10 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_f8 = ZEXT416(~-(uint)(local_d8 == (float)local_e8._0_4_) &
                           (uint)(1.0 / ((float)local_e8._0_4_ - local_d8)));
        fVar12 = (*values_getter)(local_c0,values_offset % values_count);
        if (0.0 <= (float)local_e8._0_4_ * local_d8) {
          uStack_54 = 0;
          local_58 = (float)(~-(uint)(local_d8 < 0.0) & 0x3f800000);
          uStack_50 = 0;
          uStack_4c = 0;
        }
        else {
          uStack_54 = uStack_d4 ^ 0x80000000;
          uStack_50 = uStack_d0 ^ 0x80000000;
          uStack_4c = uStack_cc ^ 0x80000000;
          local_58 = -local_d8 * (float)local_f8._0_4_;
        }
        local_88 = uVar11;
        IVar6 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        IVar8 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        if (0 < iVar10) {
          fVar14 = (float)local_f8._0_4_ * (fVar12 - local_d8);
          fVar12 = 1.0;
          if (fVar14 <= 1.0) {
            fVar12 = fVar14;
          }
          local_e8 = ZEXT416((uint)(1.0 / (float)iVar10));
          local_a4 = (float)iVar7;
          fVar13 = 0.0;
          fVar12 = (float)(-(uint)(fVar14 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar14 < 0.0) & (uint)(1.0 - fVar12));
          do {
            iVar7 = (int)(fVar13 * local_a4 + 0.5);
            fVar14 = (*values_getter)(local_c0,(values_offset + 1 + iVar7) % values_count);
            fVar18 = (float)local_e8._0_4_ + fVar13;
            fVar21 = (fVar14 - local_d8) * (float)local_f8._0_4_;
            fVar14 = 1.0;
            if (fVar21 <= 1.0) {
              fVar14 = fVar21;
            }
            fVar14 = (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar21 < 0.0) & (uint)(1.0 - fVar14));
            fVar17 = local_a0.Min.x;
            local_100.y = local_a0.Min.y;
            fVar21 = local_a0.Max.x - fVar17;
            fVar16 = local_a0.Max.y - local_100.y;
            fVar13 = fVar13 * fVar21 + fVar17;
            local_b0.y = fVar12 * fVar16 + local_100.y;
            local_b0.x = fVar13;
            local_100.x = fVar21 * fVar18 + fVar17;
            if (plot_type == ImGuiPlotType_Lines) {
              local_100.y = fVar16 * fVar14 + local_100.y;
              IVar2 = IVar6;
              if ((int)local_88 == iVar7) {
                IVar2 = IVar8;
              }
              ImDrawList::AddLine(local_b8->DrawList,&local_b0,&local_100,IVar2,1.0);
            }
            else {
              local_100.y = fVar16 * local_58 + local_100.y;
              if (plot_type == ImGuiPlotType_Histogram) {
                if (fVar13 + 2.0 <= local_100.x) {
                  local_100.x = local_100.x + -1.0;
                }
                IVar2 = IVar6;
                if ((int)local_88 == iVar7) {
                  IVar2 = IVar8;
                }
                ImDrawList::AddRectFilled(local_b8->DrawList,&local_b0,&local_100,IVar2,0.0,0xf);
              }
            }
            iVar10 = iVar10 + -1;
            fVar13 = fVar18;
            fVar12 = fVar14;
          } while (iVar10 != 0);
        }
      }
      pIVar3 = local_90;
      if (overlay_text != (char *)0x0) {
        local_b0.y = local_80.Min.y + (local_90->Style).FramePadding.y;
        local_b0.x = local_80.Min.x;
        local_100.x = 0.5;
        local_100.y = 0.0;
        RenderTextClipped(&local_b0,&local_80.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_100,
                          (ImRect *)0x0);
      }
      if (0.0 < (float)local_68._0_4_) {
        pos.x = local_80.Max.x + (pIVar3->Style).ItemInnerSpacing.x;
        pos.y = local_a0.Min.y;
        RenderText(pos,local_70,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(inner_bb, 0);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    if (values_count > 0)
    {
        int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered)
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}